

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int bitset_container_or_justcard(bitset_container_t *src_1,bitset_container_t *src_2)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint32_t c;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (croaring_detect_supported_architectures_buffer == 0x8000) {
    lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar2 = *(uint *)(lVar1 + 4);
    lVar1 = cpuid_Version_info(1);
    croaring_detect_supported_architectures_buffer =
         (*(uint *)(lVar1 + 0xc) >> 0x11 & 8 |
         uVar2 >> 2 & 0x40 | (uVar2 >> 3 & 4) + (uVar2 & 8) * 4) + (*(uint *)(lVar1 + 0xc) & 2) * 8;
    LOCK();
    UNLOCK();
  }
  if ((croaring_detect_supported_architectures_buffer & 4) != 0) {
    iVar3 = _avx2_bitset_container_or_justcard(src_1,src_2);
    return iVar3;
  }
  iVar3 = 0;
  uVar4 = 0xfffffffffffffffe;
  do {
    uVar6 = src_2->words[uVar4 + 2] | src_1->words[uVar4 + 2];
    uVar5 = src_2->words[uVar4 + 3] | src_1->words[uVar4 + 3];
    uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
    uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    iVar3 = (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
            (uint)(byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
            iVar3;
    uVar4 = uVar4 + 2;
  } while (uVar4 < 0x3fe);
  return iVar3;
}

Assistant:

static inline uint32_t croaring_detect_supported_architectures() {
    static _Atomic int buffer = CROARING_UNINITIALIZED;
    if(buffer == CROARING_UNINITIALIZED) {
      buffer = dynamic_croaring_detect_supported_architectures();
    }
    return buffer;
}